

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

wchar_t file_open(archive_conflict *a,void *client_data)

{
  wchar_t wVar1;
  int *piVar2;
  uint *puVar3;
  int *in_RSI;
  archive *in_RDI;
  char *mbs;
  wchar_t *wcs;
  stat_conflict st;
  write_file_data *mine;
  wchar_t flags;
  wchar_t **in_stack_ffffffffffffff08;
  archive_mstring *in_stack_ffffffffffffff10;
  int bytes;
  archive_conflict *in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  archive *in_stack_ffffffffffffff28;
  uint local_a0;
  int iVar4;
  wchar_t local_4;
  
  iVar4 = 0x80241;
  wVar1 = archive_mstring_get_mbs
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     (char **)in_stack_ffffffffffffff08);
  if (wVar1 == L'\0') {
    iVar4 = open((char *)0x0,iVar4,0x1b6);
    bytes = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    *in_RSI = iVar4;
    __archive_ensure_cloexec_flag(0);
    if (*in_RSI < 0) {
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"Failed to open \'%S\'",0);
      local_4 = L'\xffffffe2';
    }
    else {
      iVar4 = fstat(*in_RSI,(stat *)&stack0xffffffffffffff48);
      if (iVar4 == 0) {
        iVar4 = archive_write_get_bytes_in_last_block((archive *)in_stack_ffffffffffffff18);
        if (iVar4 < 0) {
          if ((((local_a0 & 0xf000) == 0x2000) || ((local_a0 & 0xf000) == 0x6000)) ||
             ((local_a0 & 0xf000) == 0x1000)) {
            archive_write_set_bytes_in_last_block((archive *)in_stack_ffffffffffffff18,bytes);
          }
          else {
            archive_write_set_bytes_in_last_block((archive *)in_stack_ffffffffffffff18,bytes);
          }
        }
        if ((local_a0 & 0xf000) == 0x8000) {
          archive_write_set_skip_file
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (int64_t)in_stack_ffffffffffffff18);
        }
        local_4 = L'\0';
      }
      else {
        puVar3 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar3,"Couldn\'t stat \'%S\'",0);
        local_4 = L'\xffffffe2';
      }
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"No memory");
    }
    else {
      archive_mstring_get_wcs
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t convert \'%S\' to MBS",0);
    }
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	int flags;
	struct write_file_data *mine;
	struct stat st;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *fullpath;
#endif
	const wchar_t *wcs;
	const char *mbs;

	mine = (struct write_file_data *)client_data;
	flags = O_WRONLY | O_CREAT | O_TRUNC | O_BINARY | O_CLOEXEC;

	/*
	 * Open the file.
	 */
	mbs = NULL; wcs = NULL;
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (archive_mstring_get_wcs(a, &mine->filename, &wcs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_mbs(a, &mine->filename, &mbs);
			archive_set_error(a, errno,
			    "Can't convert '%s' to WCS", mbs);
		}
		return (ARCHIVE_FATAL);
	}
	fullpath = __la_win_permissive_name_w(wcs);
	if (fullpath != NULL) {
		mine->fd = _wopen(fullpath, flags, 0666);
		free(fullpath);
	} else
		mine->fd = _wopen(wcs, flags, 0666);
#else
	if (archive_mstring_get_mbs(a, &mine->filename, &mbs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_wcs(a, &mine->filename, &wcs);
			archive_set_error(a, errno,
			    "Can't convert '%S' to MBS", wcs);
		}
		return (ARCHIVE_FATAL);
	}
	mine->fd = open(mbs, flags, 0666);
	__archive_ensure_cloexec_flag(mine->fd);
#endif
	if (mine->fd < 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Failed to open '%s'", mbs);
		else
			archive_set_error(a, errno, "Failed to open '%S'", wcs);
		return (ARCHIVE_FATAL);
	}

	if (fstat(mine->fd, &st) != 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Couldn't stat '%s'", mbs);
		else
			archive_set_error(a, errno, "Couldn't stat '%S'", wcs);
		return (ARCHIVE_FATAL);
	}

	/*
	 * Set up default last block handling.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode))
			/* Pad last block when writing to device or FIFO. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			/* Don't pad last block otherwise. */
			archive_write_set_bytes_in_last_block(a, 1);
	}

	/*
	 * If the output file is a regular file, don't add it to
	 * itself.  If it's a device file, it's okay to add the device
	 * entry to the output archive.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	return (ARCHIVE_OK);
}